

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildMultiplyRectAlpha8
               (uchar *table,uchar *pixels,int x,int y,int w,int h,int stride)

{
  int local_38;
  int local_34;
  int i;
  int j;
  uchar *data;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  uchar *pixels_local;
  uchar *table_local;
  
  _i = pixels + (long)(y * stride) + (long)x;
  for (local_34 = h; 0 < local_34; local_34 = local_34 + -1) {
    for (local_38 = 0; local_38 < w; local_38 = local_38 + 1) {
      _i[local_38] = table[_i[local_38]];
    }
    _i = _i + stride;
  }
  return;
}

Assistant:

void    ImFontAtlasBuildMultiplyRectAlpha8(const unsigned char table[256], unsigned char* pixels, int x, int y, int w, int h, int stride)
{
    unsigned char* data = pixels + x + y * stride;
    for (int j = h; j > 0; j--, data += stride)
        for (int i = 0; i < w; i++)
            data[i] = table[data[i]];
}